

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_StageDIRKNoFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is,int *nflagPtr)

{
  int iVar1;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  N_Vector in_stack_00000008;
  int retval;
  undefined4 in_stack_00000018;
  int nflag;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  *(int *)(in_RSI + 0x88) = in_EDX;
  iVar1 = mriStep_Predict((ARKodeMem)CONCAT44(is,in_stack_00000018),nflagPtr._4_4_,in_stack_00000008
                         );
  if (iVar1 != 0) {
    return iVar1;
  }
  if (*(long *)(in_RSI + 0x120) != 0) {
    iVar1 = (**(code **)(in_RSI + 0x120))
                      (*(undefined8 *)(in_RDI + 0x198),*(undefined8 *)(in_RSI + 0x78),
                       *(undefined8 *)(in_RDI + 0x10));
    if (iVar1 < 0) {
      return -0x27;
    }
    if (0 < iVar1) {
      return 5;
    }
  }
  nflag = (int)((ulong)in_RDI >> 0x20);
  iVar1 = mriStep_RKCoeffs(*(MRIStepCoupling *)(in_RSI + 0x38),in_EDX,*(int **)(in_RSI + 0x50),
                           *(realtype **)(in_RSI + 0x60),*(realtype **)(in_RSI + 0x68));
  if ((iVar1 == 0) &&
     (iVar1 = mriStep_StageSetup((ARKodeMem)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
     iVar1 == 0)) {
    iVar1 = mriStep_Nls((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        nflag);
    *in_RCX = iVar1;
    if (*in_RCX == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 5;
    }
  }
  return iVar1;
}

Assistant:

int mriStep_StageDIRKNoFast(ARKodeMem ark_mem, ARKodeMRIStepMem step_mem,
                            int is, int *nflagPtr)
{
  int retval;

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep DIRK stage\n");
#endif

  /* store current stage index */
  step_mem->istage = is;

  /* Call predictor for current stage solution (result placed in zpred) */
  retval = mriStep_Predict(ark_mem, is, step_mem->zpred);
  if (retval != ARK_SUCCESS)  return (retval);

  /* If a user-supplied predictor routine is provided, call that here
     Note that mriStep_Predict is *still* called, so this user-supplied
     routine can just 'clean up' the built-in prediction, if desired. */
  if (step_mem->stage_predict) {
    retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                     ark_mem->user_data);
    if (retval < 0)  return(ARK_USER_PREDICT_FAIL);
    if (retval > 0)  return(TRY_AGAIN);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    MRIStep predictor:\n");
  N_VPrint(step_mem->zpred);
#endif

  /* determine effective DIRK coefficients (store in cvals) */
  retval = mriStep_RKCoeffs(step_mem->MRIC, is, step_mem->stage_map,
                            step_mem->Ae_row, step_mem->Ai_row);
  if (retval != ARK_SUCCESS) { return(retval); }

  /* Set up data for evaluation of DIRK stage residual (data stored in sdata) */
  retval = mriStep_StageSetup(ark_mem);
  if (retval != ARK_SUCCESS)  return (retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  printf("    MRIStep rhs data:\n");
  N_VPrint(step_mem->sdata);
#endif

  /* perform implicit solve (result is stored in ark_mem->ycur); return
     with positive value on anything but success */
  *nflagPtr = mriStep_Nls(ark_mem, *nflagPtr);
  if (*nflagPtr != ARK_SUCCESS)  return(TRY_AGAIN);

  return(ARK_SUCCESS);
}